

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O2

void __thiscall brynet::net::TcpService::stopWorkerThread(TcpService *this)

{
  pointer psVar1;
  pointer psVar2;
  
  std::mutex::lock(&this->mServiceGuard);
  std::mutex::lock(&this->mIOLoopGuard);
  *(this->mRunIOLoop).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_ptr = false;
  psVar1 = (this->mIOLoopDatas).
           super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->mIOLoopDatas).
                super__Vector_base<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    EventLoop::wakeup((((psVar2->
                        super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->mEventLoop).
                      super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    if ((((((psVar2->super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           )->mIOThread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_id)
        ._M_thread != 0) {
      std::thread::join();
    }
  }
  std::
  vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
  ::clear(&this->mIOLoopDatas);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mIOLoopGuard);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mServiceGuard);
  return;
}

Assistant:

void TcpService::stopWorkerThread()
{
    std::lock_guard<std::mutex> lck(mServiceGuard);
    std::lock_guard<std::mutex> lock(mIOLoopGuard);

    *mRunIOLoop = false;

    for (const auto& v : mIOLoopDatas)
    {
        v->getEventLoop()->wakeup();
        try
        {
            if (v->getIOThread()->joinable())
            {
                v->getIOThread()->join();
            }
        }
        catch (...)
        {
        }
    }
    mIOLoopDatas.clear();
}